

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_mgr.cxx
# Opt level: O0

void __thiscall
nuraft::nuraft_global_mgr::append_worker_loop(nuraft_global_mgr *this,ptr<worker_handle> *handle)

{
  bool bVar1;
  pthread_t __target_thread;
  char *__name;
  element_type *peVar2;
  element_type *peVar3;
  raft_server *in_RSI;
  long in_RDI;
  ptr<logger> *l_;
  iterator entry;
  lock_guard<std::mutex> l;
  ptr<raft_server> target;
  size_t queue_length;
  bool skip_sleeping;
  string thread_name;
  undefined4 in_stack_fffffffffffffef8;
  status in_stack_fffffffffffffefc;
  EventAwaiter *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  string local_c0 [32];
  ptr<logger> *local_a0;
  undefined4 local_94;
  _Self local_90;
  _Self local_88 [2];
  __shared_ptr local_78 [16];
  size_type local_68;
  byte local_5d;
  string local_50 [32];
  string local_30 [48];
  
  std::
  __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16ff2b);
  std::__cxx11::to_string((unsigned_long)local_50);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_50);
  __target_thread = pthread_self();
  __name = (char *)std::__cxx11::string::c_str();
  pthread_setname_np(__target_thread,__name);
  local_5d = 0;
  while( true ) {
    std::
    __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16ff9e);
    bVar1 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    if ((local_5d & 1) == 0) {
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x16ffcd);
      std::atomic<nuraft::nuraft_global_mgr::worker_handle::status>::operator=
                ((atomic<nuraft::nuraft_global_mgr::worker_handle::status> *)
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x16ffe5);
      EventAwaiter::wait_ms
                (in_stack_ffffffffffffff00,
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x170002);
      EventAwaiter::reset((EventAwaiter *)0x17000e);
      std::
      __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x17001a);
      std::atomic<nuraft::nuraft_global_mgr::worker_handle::status>::operator=
                ((atomic<nuraft::nuraft_global_mgr::worker_handle::status> *)
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    }
    std::
    __shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<nuraft::nuraft_global_mgr::worker_handle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x170076);
    bVar1 = std::atomic::operator_cast_to_bool
                      ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                      );
    if (bVar1) break;
    local_5d = 0;
    local_68 = 0;
    std::shared_ptr<nuraft::raft_server>::shared_ptr
              ((shared_ptr<nuraft::raft_server> *)in_stack_ffffffffffffff00,
               (nullptr_t)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_ffffffffffffff00,
               (mutex_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_88[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
         ::begin((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
         ::end((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar1 = std::operator!=(local_88,&local_90);
    if (bVar1) {
      std::_List_iterator<std::shared_ptr<nuraft::raft_server>_>::operator*
                ((_List_iterator<std::shared_ptr<nuraft::raft_server>_> *)0x170124);
      std::shared_ptr<nuraft::raft_server>::operator=
                ((shared_ptr<nuraft::raft_server> *)in_stack_ffffffffffffff00,
                 (shared_ptr<nuraft::raft_server> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      std::
      unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::erase((unordered_set<std::shared_ptr<nuraft::raft_server>,_std::hash<std::shared_ptr<nuraft::raft_server>_>,_std::equal_to<std::shared_ptr<nuraft::raft_server>_>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
               *)in_stack_ffffffffffffff00,
              (key_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      std::__cxx11::
      list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
      ::pop_front((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                   *)in_stack_ffffffffffffff00);
      local_68 = std::__cxx11::
                 list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                 ::size((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                         *)in_stack_ffffffffffffff00);
      bVar1 = std::__cxx11::
              list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
              ::empty((list<std::shared_ptr<nuraft::raft_server>,_std::allocator<std::shared_ptr<nuraft::raft_server>_>_>
                       *)(in_RDI + 0x100));
      if (!bVar1) {
        local_5d = 1;
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1701e8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x170213);
      local_a0 = &peVar2->l_;
      local_5d = 1;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a0);
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x170243);
        in_stack_ffffffffffffff0c = (**(code **)(*(long *)peVar3 + 0x38))();
        if (5 < in_stack_ffffffffffffff0c) {
          in_stack_ffffffffffffff00 =
               (EventAwaiter *)
               std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x17026c);
          msg_if_given_abi_cxx11_
                    ((char *)local_c0,"executed append_entries by global worker, queue length %zu",
                     local_68);
          (**(code **)(*(long *)in_stack_ffffffffffffff00 + 0x40))
                    (in_stack_ffffffffffffff00,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/global_mgr.cxx"
                     ,"append_worker_loop",0x187,local_c0);
          std::__cxx11::string::~string(local_c0);
        }
      }
      std::__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1702f5);
      raft_server::append_entries_in_bg_exec(in_RSI);
      local_94 = 0;
    }
    else {
      local_94 = 2;
    }
    std::shared_ptr<nuraft::raft_server>::~shared_ptr((shared_ptr<nuraft::raft_server> *)0x170314);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void nuraft_global_mgr::append_worker_loop(ptr<worker_handle> handle) {
    std::string thread_name = "nuraft_g_a" + std::to_string(handle->id_);
#ifdef __linux__
    pthread_setname_np(pthread_self(), thread_name.c_str());
#elif __APPLE__
    pthread_setname_np(thread_name.c_str());
#endif

    bool skip_sleeping = false;
    while (!handle->stopping_) {
        if (!skip_sleeping) {
            handle->status_ = worker_handle::SLEEPING;
            // Ditto, just in case.
            handle->ea_.wait_ms(1000);
            handle->ea_.reset();
            handle->status_ = worker_handle::WORKING;
        }
        if (handle->stopping_) break;

        skip_sleeping = false;
        size_t queue_length = 0;
        ptr<raft_server> target = nullptr;
        {
            std::lock_guard<std::mutex> l(append_queue_lock_);
            auto entry = append_queue_.begin();
            if (entry != append_queue_.end()) {
                target = *entry;
                append_server_set_.erase(target);
                append_queue_.pop_front();
                queue_length = append_queue_.size();
                if (!append_queue_.empty()) {
                    // Other requests are waiting in the queue,
                    // skip sleeping next time.
                    skip_sleeping = true;
                }
            }
        }
        if (!target) continue;

        ptr<logger>& l_ = target->l_;

        // Whenever we find a task to execute, skip next sleeping for any tasks
        // that can be queued in the meantime.
        skip_sleeping = true;

        p_tr("executed append_entries by global worker, queue length %zu",
             queue_length);
        target->append_entries_in_bg_exec();
    }
}